

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Cnf_AddCardinConstrPairWise(sat_solver *p,Vec_Int_t *vVars,int K,int fStrict)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int *pVars;
  int local_38;
  int nVarsOld;
  int Lit;
  int nSize;
  int iVar;
  int i;
  int nSizeOld;
  int nVars;
  int fStrict_local;
  int K_local;
  Vec_Int_t *vVars_local;
  sat_solver *p_local;
  
  nSizeOld = fStrict;
  nVars = K;
  _fStrict_local = vVars;
  vVars_local = (Vec_Int_t *)p;
  i = sat_solver_nvars(p);
  iVar = Vec_IntSize(_fStrict_local);
  if (iVar < 2) {
    __assert_fail("nSizeOld >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x73,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
  }
  for (nSize = 0; iVar2 = nSize, iVar1 = Vec_IntSize(_fStrict_local), iVar2 < iVar1;
      nSize = nSize + 1) {
    Lit = Vec_IntEntry(_fStrict_local,nSize);
    if ((Lit < 0) || (i <= Lit)) {
      __assert_fail("iVar >= 0 && iVar < nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x76,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  for (nVarsOld = 1; nVarsOld < iVar; nVarsOld = nVarsOld << 1) {
  }
  sat_solver_setnvars((sat_solver *)vVars_local,i + 1 + (nVarsOld * nVarsOld) / 2);
  if (nVarsOld != iVar) {
    Vec_IntFillExtra(_fStrict_local,nVarsOld,i);
    iVar2 = i;
    i = i + 1;
    local_38 = Abc_Var2Lit(iVar2,1);
    iVar2 = sat_solver_addclause((sat_solver *)vVars_local,&local_38,&nVarsOld);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x82,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  p_00 = vVars_local;
  pVars = Vec_IntArray(_fStrict_local);
  Cnf_AddCardinConstrRange((sat_solver *)p_00,pVars,0,nVarsOld + -1,&i);
  if ((0 < nVars) && (nVars < iVar)) {
    iVar2 = Vec_IntEntry(_fStrict_local,nVars);
    local_38 = Abc_Var2Lit(iVar2,1);
    iVar2 = sat_solver_addclause((sat_solver *)vVars_local,&local_38,&nVarsOld);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x8b,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
    }
    if (nSizeOld != 0) {
      iVar2 = Vec_IntEntry(_fStrict_local,nVars + -1);
      local_38 = Abc_Var2Lit(iVar2,0);
      iVar2 = sat_solver_addclause((sat_solver *)vVars_local,&local_38,&nVarsOld);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0x90,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)")
        ;
      }
    }
    Vec_IntShrink(_fStrict_local,0);
    return;
  }
  __assert_fail("K > 0 && K < nSizeOld",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0x88,"void Cnf_AddCardinConstrPairWise(sat_solver *, Vec_Int_t *, int, int)");
}

Assistant:

void Cnf_AddCardinConstrPairWise( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict )
{
    int nVars = sat_solver_nvars(p);
    int nSizeOld = Vec_IntSize(vVars);
    int i, iVar, nSize, Lit, nVarsOld;
    assert( nSizeOld >= 2 );
    // check that vars are ok
    Vec_IntForEachEntry( vVars, iVar, i )
        assert( iVar >= 0 && iVar < nVars );
    // make the size a degree of two
    for ( nSize = 1; nSize < nSizeOld; nSize *= 2 );
    // extend
    sat_solver_setnvars( p, nVars + 1 + nSize * nSize / 2 );
    if ( nSize != nSizeOld )
    {
        // fill in with const0
        Vec_IntFillExtra( vVars, nSize, nVars );
        // add const0 variable
        Lit = Abc_Var2Lit( nVars++, 1 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
    // construct recursively
    nVarsOld = nVars;
    Cnf_AddCardinConstrRange( p, Vec_IntArray(vVars), 0, nSize - 1, &nVars );
    // add final constraint
    assert( K > 0 && K < nSizeOld );
    Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K), 1 );
    if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
        assert( 0 );
    if ( fStrict )
    {
        Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K-1), 0 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
    // return to the old size
    Vec_IntShrink( vVars, 0 ); // make it unusable
    //printf( "The %d input sorting network contains %d sorters.\n", nSize, (nVars - nVarsOld)/2 );
}